

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.h
# Opt level: O2

Expression __thiscall cnn::FastLSTMBuilder::back(FastLSTMBuilder *this)

{
  long lVar1;
  _func_int **pp_Var2;
  long *plVar3;
  long in_RSI;
  Expression EVar4;
  
  plVar3 = (long *)(*(long *)(in_RSI + 0x58) + 8 + (long)*(int *)(in_RSI + 8) * 0x18);
  if ((long)*(int *)(in_RSI + 8) == -1) {
    plVar3 = (long *)(in_RSI + 0x98);
  }
  lVar1 = *plVar3;
  pp_Var2 = *(_func_int ***)(lVar1 + -0x10);
  (this->super_RNNBuilder)._vptr_RNNBuilder = pp_Var2;
  (this->super_RNNBuilder).cur.t = *(int *)(lVar1 + -8);
  EVar4._8_8_ = pp_Var2;
  EVar4.pg = (ComputationGraph *)this;
  return EVar4;
}

Assistant:

Expression back() const override { return (cur == -1? h0.back() : h[cur].back()); }